

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::Lookup
          (PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *this,long *value)

{
  primitive_dictionary_entry_t *ppVar1;
  hash_t hVar2;
  ulong uVar3;
  primitive_dictionary_entry_t *ppVar4;
  
  hVar2 = Hash<long>(*value);
  ppVar1 = this->dictionary;
  uVar3 = hVar2 & this->capacity_mask;
  ppVar4 = ppVar1 + uVar3;
  if (ppVar1[uVar3].index != 0xffffffff) {
    do {
      if (ppVar4->value == *value) {
        return ppVar4;
      }
      uVar3 = uVar3 + 1 & this->capacity_mask;
      ppVar4 = ppVar1 + uVar3;
    } while (ppVar1[uVar3].index != 0xffffffff);
  }
  return ppVar4;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}